

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayImageTextureSize.cpp
# Opt level: O1

void __thiscall
glcts::TextureCubeMapArrayTextureSizeRTComputeShader::deleteTestSpecificObjects
          (TextureCubeMapArrayTextureSizeRTComputeShader *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TextureCubeMapArrayTextureSizeRTBase).
             super_TextureCubeMapArrayTextureSizeBase.super_TestCaseBase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar2 + 8))(0x84c2);
  (**(code **)(lVar2 + 0xb8))(0xde1,0);
  if (this->m_rt_img_id != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_rt_img_id);
    this->m_rt_img_id = 0;
  }
  TextureCubeMapArrayTextureSizeRTBase::deleteTestSpecificObjects
            (&this->super_TextureCubeMapArrayTextureSizeRTBase);
  return;
}

Assistant:

void TextureCubeMapArrayTextureSizeRTComputeShader::deleteTestSpecificObjects(void)
{
	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reset GL state */
	gl.activeTexture(GL_TEXTURE2);
	gl.bindTexture(GL_TEXTURE_2D, 0);

	/* Delete GL objects */
	if (m_rt_img_id != 0)
	{
		gl.deleteTextures(1, &m_rt_img_id);
		m_rt_img_id = 0;
	}

	TextureCubeMapArrayTextureSizeRTBase::deleteTestSpecificObjects();
}